

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O0

void __thiscall sha1::SHA1::processBlock(SHA1 *this)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  long in_RDI;
  uint32_t temp;
  uint32_t k;
  uint32_t f;
  size_t i_2;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t i_1;
  size_t i;
  uint32_t w [80];
  uint auStack_188 [4];
  ulong local_178;
  uint local_16c;
  uint local_168 [3];
  uint32_t local_15c;
  undefined8 local_158;
  ulong local_150;
  uint auStack_148 [82];
  
  for (local_150 = 0; local_150 < 0x10; local_150 = local_150 + 1) {
    auStack_148[local_150] = (uint)*(byte *)(in_RDI + 0x1c + local_150 * 4) << 0x18;
    auStack_148[local_150] =
         (uint)*(byte *)(in_RDI + 0x1d + local_150 * 4) << 0x10 | auStack_148[local_150];
    auStack_148[local_150] =
         (uint)*(byte *)(in_RDI + 0x1e + local_150 * 4) << 8 | auStack_148[local_150];
    auStack_148[local_150] = (uint)*(byte *)(in_RDI + 0x1f + local_150 * 4) | auStack_148[local_150]
    ;
  }
  for (local_158 = 0x10; local_158 < 0x50; local_158 = local_158 + 1) {
    uVar2 = LeftRotate(auStack_148[local_158 - 3] ^ auStack_148[local_158 - 8] ^
                       auStack_148[local_158 - 0xe] ^ auStack_148[local_158 - 0x10],1);
    auStack_148[local_158] = uVar2;
  }
  local_168[2] = *(uint *)(in_RDI + 0xc);
  local_168[1] = *(uint *)(in_RDI + 0x10);
  local_168[0] = *(uint *)(in_RDI + 0x14);
  local_16c = *(uint *)(in_RDI + 0x18);
  local_15c = *(uint32_t *)(in_RDI + 8);
  for (local_178 = 0; local_178 < 0x50; local_178 = local_178 + 1) {
    if (local_178 < 0x14) {
      auStack_188[3] = local_168[2] & local_168[1] | (local_168[2] ^ 0xffffffff) & local_168[0];
      auStack_188[2] = 0x5a827999;
    }
    else if (local_178 < 0x28) {
      auStack_188[3] = local_168[2] ^ local_168[1] ^ local_168[0];
      auStack_188[2] = 0x6ed9eba1;
    }
    else if (local_178 < 0x3c) {
      auStack_188[3] = local_168[2] & (local_168[1] | local_168[0]) | local_168[1] & local_168[0];
      auStack_188[2] = -0x70e44324;
    }
    else {
      auStack_188[3] = local_168[2] ^ local_168[1] ^ local_168[0];
      auStack_188[2] = -0x359d3e2a;
    }
    uVar2 = LeftRotate(local_15c,5);
    iVar3 = uVar2 + auStack_188[3] + local_16c;
    uVar1 = auStack_148[local_178];
    local_16c = local_168[0];
    local_168[0] = local_168[1];
    local_168[1] = LeftRotate(local_168[2],0x1e);
    local_168[2] = local_15c;
    local_15c = iVar3 + auStack_188[2] + uVar1;
  }
  *(uint32_t *)(in_RDI + 8) = local_15c + *(int *)(in_RDI + 8);
  *(uint *)(in_RDI + 0xc) = local_168[2] + *(int *)(in_RDI + 0xc);
  *(uint *)(in_RDI + 0x10) = local_168[1] + *(int *)(in_RDI + 0x10);
  *(uint *)(in_RDI + 0x14) = local_168[0] + *(int *)(in_RDI + 0x14);
  *(uint *)(in_RDI + 0x18) = local_16c + *(int *)(in_RDI + 0x18);
  return;
}

Assistant:

void processBlock() {
    uint32_t w[80];
    for (size_t i = 0; i < 16; i++) {
      w[i] = (m_block[i * 4 + 0] << 24);
      w[i] |= (m_block[i * 4 + 1] << 16);
      w[i] |= (m_block[i * 4 + 2] << 8);
      w[i] |= (m_block[i * 4 + 3]);
    }
    for (size_t i = 16; i < 80; i++) {
      w[i] = LeftRotate((w[i - 3] ^ w[i - 8] ^ w[i - 14] ^ w[i - 16]), 1);
    }

    uint32_t a = m_digest[0];
    uint32_t b = m_digest[1];
    uint32_t c = m_digest[2];
    uint32_t d = m_digest[3];
    uint32_t e = m_digest[4];

    for (std::size_t i = 0; i < 80; ++i) {
      uint32_t f = 0;
      uint32_t k = 0;

      if (i < 20) {
        f = (b & c) | (~b & d);
        k = 0x5A827999;
      } else if (i < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (i < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }
      uint32_t temp = LeftRotate(a, 5) + f + e + k + w[i];
      e = d;
      d = c;
      c = LeftRotate(b, 30);
      b = a;
      a = temp;
    }

    m_digest[0] += a;
    m_digest[1] += b;
    m_digest[2] += c;
    m_digest[3] += d;
    m_digest[4] += e;
  }